

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLog>::operator()
          (StairsRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  ImVec2 IVar3;
  ImU32 IVar4;
  uint uVar5;
  GetterXsYs<double> *pGVar6;
  TransformerLinLog *pTVar7;
  ImPlotPlot *pIVar8;
  ImDrawVert *pIVar9;
  ImDrawIdx *pIVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [12];
  ImPlotContext *pIVar13;
  int iVar14;
  long lVar15;
  ImDrawIdx IVar16;
  double dVar17;
  ImVec2 IVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  pIVar13 = GImPlot;
  pGVar6 = this->Getter;
  pTVar7 = this->Transformer;
  iVar14 = pGVar6->Count;
  lVar15 = (long)(((pGVar6->Offset + prim + 1) % iVar14 + iVar14) % iVar14) * (long)pGVar6->Stride;
  dVar1 = *(double *)((long)pGVar6->Xs + lVar15);
  dVar17 = log10(*(double *)((long)pGVar6->Ys + lVar15) /
                 GImPlot->CurrentPlot->YAxis[pTVar7->YAxis].Range.Min);
  iVar14 = pTVar7->YAxis;
  pIVar8 = pIVar13->CurrentPlot;
  dVar2 = pIVar8->YAxis[iVar14].Range.Min;
  IVar3 = pIVar13->PixelRange[iVar14].Min;
  IVar18.x = (float)(pIVar13->Mx * (dVar1 - (pIVar8->XAxis).Range.Min) + (double)IVar3.x);
  IVar18.y = (float)(pIVar13->My[iVar14] *
                     (((double)(float)(dVar17 / pIVar13->LogDenY[iVar14]) *
                       (pIVar8->YAxis[iVar14].Range.Max - dVar2) + dVar2) - dVar2) + (double)IVar3.y
                    );
  fVar19 = (this->P1).x;
  fVar20 = (this->P1).y;
  auVar22._0_4_ = ~-(uint)(IVar18.x <= fVar19) & (uint)IVar18.x;
  auVar22._4_4_ = ~-(uint)(IVar18.y <= fVar20) & (uint)IVar18.y;
  auVar22._8_4_ = ~-(uint)(fVar19 < IVar18.x) & (uint)IVar18.x;
  auVar22._12_4_ = ~-(uint)(fVar20 < IVar18.y) & (uint)IVar18.y;
  auVar11._4_4_ = (uint)fVar20 & -(uint)(IVar18.y <= fVar20);
  auVar11._0_4_ = (uint)fVar19 & -(uint)(IVar18.x <= fVar19);
  auVar11._8_4_ = (uint)fVar19 & -(uint)(fVar19 < IVar18.x);
  auVar11._12_4_ = (uint)fVar20 & -(uint)(fVar20 < IVar18.y);
  auVar22 = auVar22 | auVar11;
  fVar21 = (cull_rect->Min).y;
  auVar12._4_8_ = auVar22._8_8_;
  auVar12._0_4_ = -(uint)(auVar22._4_4_ < fVar21);
  auVar23._0_8_ = auVar12._0_8_ << 0x20;
  auVar23._8_4_ = -(uint)(auVar22._8_4_ < (cull_rect->Max).x);
  auVar23._12_4_ = -(uint)(auVar22._12_4_ < (cull_rect->Max).y);
  auVar24._4_4_ = -(uint)(fVar21 < auVar22._4_4_);
  auVar24._0_4_ = -(uint)((cull_rect->Min).x < auVar22._0_4_);
  auVar24._8_8_ = auVar23._8_8_;
  iVar14 = movmskps((int)pIVar8,auVar24);
  if (iVar14 == 0xf) {
    fVar21 = fVar20 + this->HalfWeight;
    fVar20 = fVar20 - this->HalfWeight;
    IVar4 = this->Col;
    IVar3 = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    (pIVar9->pos).x = fVar19;
    (pIVar9->pos).y = fVar21;
    DrawList->_VtxWritePtr->uv = IVar3;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = IVar4;
    pIVar9[1].pos.x = IVar18.x;
    pIVar9[1].pos.y = fVar20;
    DrawList->_VtxWritePtr[1].uv = IVar3;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar4;
    pIVar9[2].pos.x = fVar19;
    pIVar9[2].pos.y = fVar20;
    pIVar9[2].uv = IVar3;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar4;
    pIVar9[3].pos.x = IVar18.x;
    pIVar9[3].pos.y = fVar21;
    pIVar9[3].uv = IVar3;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar4;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    uVar5 = DrawList->_VtxCurrentIdx;
    pIVar10 = DrawList->_IdxWritePtr;
    IVar16 = (ImDrawIdx)uVar5;
    *pIVar10 = IVar16;
    pIVar10[1] = IVar16 + 1;
    pIVar10[2] = IVar16 + 2;
    pIVar10[3] = IVar16;
    pIVar10[4] = IVar16 + 1;
    pIVar10[5] = IVar16 + 3;
    DrawList->_IdxWritePtr = pIVar10 + 6;
    DrawList->_VtxCurrentIdx = uVar5 + 4;
    fVar20 = IVar18.x - this->HalfWeight;
    fVar19 = this->HalfWeight + IVar18.x;
    fVar21 = (this->P1).y;
    IVar4 = this->Col;
    IVar3 = *uv;
    pIVar9[4].pos.x = fVar20;
    pIVar9[4].pos.y = IVar18.y;
    DrawList->_VtxWritePtr->uv = IVar3;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = IVar4;
    pIVar9[1].pos.x = fVar19;
    pIVar9[1].pos.y = fVar21;
    DrawList->_VtxWritePtr[1].uv = IVar3;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar4;
    pIVar9[2].pos.x = fVar20;
    pIVar9[2].pos.y = fVar21;
    pIVar9[2].uv = IVar3;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar4;
    pIVar9[3].pos.x = fVar19;
    pIVar9[3].pos.y = IVar18.y;
    pIVar9[3].uv = IVar3;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar4;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    uVar5 = DrawList->_VtxCurrentIdx;
    pIVar10 = DrawList->_IdxWritePtr;
    IVar16 = (ImDrawIdx)uVar5;
    *pIVar10 = IVar16;
    pIVar10[1] = IVar16 + 1;
    pIVar10[2] = IVar16 + 2;
    pIVar10[3] = IVar16;
    pIVar10[4] = IVar16 + 1;
    pIVar10[5] = IVar16 + 3;
    DrawList->_IdxWritePtr = pIVar10 + 6;
    DrawList->_VtxCurrentIdx = uVar5 + 4;
  }
  this->P1 = IVar18;
  return (char)iVar14 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }